

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O3

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::texcoord2d>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,texcoord2d *v)

{
  vtable_type *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  pointer pSVar4;
  pointer pSVar5;
  optional<tinyusdz::value::texcoord2d> local_68 [3];
  
  if (v == (texcoord2d *)0x0) {
    return false;
  }
  if (NAN(t)) {
    get_value<tinyusdz::value::texcoord2d>(local_68,this);
    if (local_68[0].has_value_ == true) goto LAB_001efa19;
    pSVar4 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar4 == pSVar5) {
      return false;
    }
  }
  else {
    pSVar4 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pSVar5 != pSVar4) {
    bVar2 = tinyusdz::value::TimeSamples::get<tinyusdz::value::texcoord2d,_nullptr>
                      (&this->_ts,v,t,tinterp);
    return bVar2;
  }
  if ((((this->_blocked == false) &&
       (pvVar1 = (this->_value).v_.vtable, pvVar1 != (vtable_type *)0x0)) &&
      ((uVar3 = (*pvVar1->type_id)(), uVar3 == 0 ||
       ((pvVar1 = (this->_value).v_.vtable, pvVar1 != (vtable_type *)0x0 &&
        (uVar3 = (*pvVar1->type_id)(), uVar3 == 1)))))) ||
     (get_value<tinyusdz::value::texcoord2d>(local_68,this), local_68[0].has_value_ == false)) {
    return false;
  }
LAB_001efa19:
  v->s = (double)local_68[0].contained._0_8_;
  v->t = (double)local_68[0].contained._8_8_;
  return true;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }